

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

mpack_error_t mpack_reader_destroy(mpack_reader_t *reader)

{
  if (reader->teardown != (mpack_reader_teardown_t)0x0) {
    (*reader->teardown)(reader);
  }
  reader->teardown = (mpack_reader_teardown_t)0x0;
  return reader->error;
}

Assistant:

mpack_error_t mpack_reader_destroy(mpack_reader_t* reader) {

    // clean up tracking, asserting if we're not already in an error state
    #if MPACK_READ_TRACKING
    mpack_reader_flag_if_error(reader, mpack_track_destroy(&reader->track, mpack_reader_error(reader) != mpack_ok));
    #endif

    if (reader->teardown)
        reader->teardown(reader);
    reader->teardown = NULL;

    return reader->error;
}